

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarScrollingButtons(ImGuiTabBar *tab_bar)

{
  float fVar1;
  float fVar2;
  ImVec2 size;
  ImVec2 size_00;
  bool bVar3;
  int i;
  ImGuiWindowTempData *min;
  ImGuiTabItem *pIVar4;
  ImVector<ImGuiTabItem> *in_RDI;
  int target_order;
  int selected_order;
  ImGuiTabItem *tab_item;
  float backup_repeat_rate;
  float backup_repeat_delay;
  ImVec4 arrow_col;
  int select_dir;
  ImGuiTabItem *tab_to_select;
  bool want_clip_rect;
  ImRect avail_bar_rect;
  ImVec2 backup_cursor_pos;
  float scrolling_buttons_width;
  ImVec2 arrow_button_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  ImVec4 *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  ImVec2 *this;
  ImGuiCol idx;
  ImVec2 *clip_rect_max;
  ImVec2 *this_00;
  ImVec2 local_d8 [2];
  ImVec2 local_c8;
  float local_c0;
  float local_bc;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  int local_8c;
  ImGuiTabItem *local_88;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImRect local_5c;
  byte local_49;
  ImRect local_48;
  ImVec2 local_30;
  float local_24;
  ImVec2 local_20;
  ImGuiWindow *local_18;
  ImGuiContext *local_10;
  ImVector<ImGuiTabItem> *local_8;
  
  idx = (ImGuiCol)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  local_10 = GImGui;
  local_18 = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).FramePadding.y;
  local_8 = in_RDI;
  ImVec2::ImVec2(&local_20,GImGui->FontSize + -2.0,fVar1 + fVar1 + GImGui->FontSize);
  local_24 = local_20.x + local_20.x;
  local_30 = (local_18->DC).CursorPos;
  local_48.Min = (ImVec2)local_8[2].Data;
  local_48.Max.x = (float)local_8[3].Size;
  local_48.Max.y = (float)local_8[3].Capacity;
  min = &local_18->DC;
  this_00 = &local_6c;
  ImVec2::ImVec2(this_00,local_24,0.0);
  local_64 = operator+((ImVec2 *)in_stack_fffffffffffffec8,(ImVec2 *)0x194c55);
  ImRect::ImRect(&local_5c,&min->CursorPos,&local_64);
  bVar3 = ImRect::Contains(&local_48,&local_5c);
  local_49 = (bVar3 ^ 0xffU) & 1;
  if (local_49 != 0) {
    clip_rect_max = (ImVec2 *)&local_8[2].Data;
    in_stack_fffffffffffffee8 = (ImVec4 *)(local_8 + 3);
    this = &local_7c;
    ImVec2::ImVec2(this,(local_10->Style).ItemInnerSpacing.x,0.0);
    idx = (ImGuiCol)((ulong)this >> 0x20);
    local_74 = operator+((ImVec2 *)in_stack_fffffffffffffec8,(ImVec2 *)0x194cf3);
    PushClipRect(this_00,clip_rect_max,SUB41((uint)idx >> 0x18,0));
  }
  local_88 = (ImGuiTabItem *)0x0;
  local_8c = 0;
  fVar1 = (local_10->Style).Colors[0].y;
  fVar2 = (local_10->Style).Colors[0].z;
  PushStyleColor(idx,in_stack_fffffffffffffee8);
  ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffff48,0.0,0.0,0.0,0.0);
  PushStyleColor(idx,in_stack_fffffffffffffee8);
  local_bc = (local_10->IO).KeyRepeatDelay;
  local_c0 = (local_10->IO).KeyRepeatRate;
  (local_10->IO).KeyRepeatDelay = 0.25;
  (local_10->IO).KeyRepeatRate = 0.2;
  ImVec2::ImVec2(&local_c8,(float)local_8[3].Size - local_24,*(float *)((long)&local_8[2].Data + 4))
  ;
  (local_18->DC).CursorPos = local_c8;
  size.y = fVar2;
  size.x = fVar1;
  bVar3 = ArrowButtonEx(in_stack_ffffffffffffff50,(ImGuiDir)in_stack_ffffffffffffff4c,size,
                        (ImGuiButtonFlags)in_stack_ffffffffffffff48);
  if (bVar3) {
    local_8c = -1;
  }
  ImVec2::ImVec2(local_d8,((float)local_8[3].Size - local_24) + local_20.x,
                 *(float *)((long)&local_8[2].Data + 4));
  (local_18->DC).CursorPos = local_d8[0];
  size_00.y = fVar2;
  size_00.x = fVar1;
  bVar3 = ArrowButtonEx(in_stack_ffffffffffffff50,(ImGuiDir)in_stack_ffffffffffffff4c,size_00,
                        (ImGuiButtonFlags)in_stack_ffffffffffffff48);
  if (bVar3) {
    local_8c = 1;
  }
  PopStyleColor(in_stack_fffffffffffffed4);
  (local_10->IO).KeyRepeatRate = local_c0;
  (local_10->IO).KeyRepeatDelay = local_bc;
  if ((local_49 & 1) != 0) {
    PopClipRect();
  }
  if ((local_8c != 0) &&
     (pIVar4 = TabBarFindTabByID(in_stack_fffffffffffffec8,0), pIVar4 != (ImGuiTabItem *)0x0)) {
    i = ImGuiTabBar::GetTabOrder
                  ((ImGuiTabBar *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (ImGuiTabItem *)in_stack_fffffffffffffec8);
    local_8c = i + local_8c;
    if ((-1 < local_8c) && (local_8c < local_8->Size)) {
      i = local_8c;
    }
    local_88 = ImVector<ImGuiTabItem>::operator[](local_8,i);
  }
  (local_18->DC).CursorPos = local_30;
  local_8[3].Size = (int)((float)local_8[3].Size - (local_24 + 1.0));
  return local_88;
}

Assistant:

static ImGuiTabItem* ImGui::TabBarScrollingButtons(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImVec2 arrow_button_size(g.FontSize - 2.0f, g.FontSize + g.Style.FramePadding.y * 2.0f);
    const float scrolling_buttons_width = arrow_button_size.x * 2.0f;

    const ImVec2 backup_cursor_pos = window->DC.CursorPos;
    //window->DrawList->AddRect(ImVec2(tab_bar->BarRect.Max.x - scrolling_buttons_width, tab_bar->BarRect.Min.y), ImVec2(tab_bar->BarRect.Max.x, tab_bar->BarRect.Max.y), IM_COL32(255,0,0,255));

    const ImRect avail_bar_rect = tab_bar->BarRect;
    bool want_clip_rect = !avail_bar_rect.Contains(ImRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(scrolling_buttons_width, 0.0f)));
    if (want_clip_rect)
        PushClipRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max + ImVec2(g.Style.ItemInnerSpacing.x, 0.0f), true);

    ImGuiTabItem* tab_to_select = NULL;

    int select_dir = 0;
    ImVec4 arrow_col = g.Style.Colors[ImGuiCol_Text];
    arrow_col.w *= 0.5f;

    PushStyleColor(ImGuiCol_Text, arrow_col);
    PushStyleColor(ImGuiCol_Button, ImVec4(0, 0, 0, 0));
    const float backup_repeat_delay = g.IO.KeyRepeatDelay;
    const float backup_repeat_rate = g.IO.KeyRepeatRate;
    g.IO.KeyRepeatDelay = 0.250f;
    g.IO.KeyRepeatRate = 0.200f;
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Max.x - scrolling_buttons_width, tab_bar->BarRect.Min.y);
    if (ArrowButtonEx("##<", ImGuiDir_Left, arrow_button_size, ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_Repeat))
        select_dir = -1;
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Max.x - scrolling_buttons_width + arrow_button_size.x, tab_bar->BarRect.Min.y);
    if (ArrowButtonEx("##>", ImGuiDir_Right, arrow_button_size, ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_Repeat))
        select_dir = +1;
    PopStyleColor(2);
    g.IO.KeyRepeatRate = backup_repeat_rate;
    g.IO.KeyRepeatDelay = backup_repeat_delay;

    if (want_clip_rect)
        PopClipRect();

    if (select_dir != 0)
        if (ImGuiTabItem* tab_item = TabBarFindTabByID(tab_bar, tab_bar->SelectedTabId))
        {
            int selected_order = tab_bar->GetTabOrder(tab_item);
            int target_order = selected_order + select_dir;
            tab_to_select = &tab_bar->Tabs[(target_order >= 0 && target_order < tab_bar->Tabs.Size) ? target_order : selected_order]; // If we are at the end of the list, still scroll to make our tab visible
        }
    window->DC.CursorPos = backup_cursor_pos;
    tab_bar->BarRect.Max.x -= scrolling_buttons_width + 1.0f;

    return tab_to_select;
}